

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_test.cpp
# Opt level: O2

counter * counter::instance(string *name)

{
  __type _Var1;
  int iVar2;
  char *pcVar3;
  counter *__lhs;
  long lVar4;
  
  if ((instance(std::__cxx11::string_const&)::all == '\0') &&
     (iVar2 = __cxa_guard_acquire(&instance(std::__cxx11::string_const&)::all), iVar2 != 0)) {
    lVar4 = 0;
    do {
      pcVar3 = instance::all[0].name.field_2._M_local_buf + lVar4;
      *(char **)((long)&instance::all[0].name._M_dataplus._M_p + lVar4) = pcVar3;
      *(undefined8 *)((long)&instance::all[0].name._M_string_length + lVar4) = 0;
      *pcVar3 = '\0';
      *(undefined8 *)((long)&instance::all[0].current + lVar4) = 0;
      *(undefined4 *)((long)&instance::all[0].total + lVar4) = 0;
      *(undefined8 *)((long)&instance::all[0].lock_.super___mutex_base._M_mutex + lVar4 + 0x20) = 0;
      *(undefined8 *)((long)&instance::all[0].lock_.super___mutex_base._M_mutex + lVar4) = 0;
      *(undefined8 *)((long)&instance::all[0].lock_.super___mutex_base._M_mutex + lVar4 + 8) = 0;
      *(undefined8 *)((long)&instance::all[0].lock_.super___mutex_base._M_mutex + lVar4 + 0x10) = 0;
      *(undefined8 *)((long)&instance::all[0].lock_.super___mutex_base._M_mutex + lVar4 + 0x18) = 0;
      lVar4 = lVar4 + 0x58;
    } while (lVar4 != 0x6e0);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&instance(std::__cxx11::string_const&)::all);
  }
  lVar4 = -1;
  __lhs = instance::all;
  do {
    lVar4 = lVar4 + 1;
    if (instance::curr <= lVar4) {
      std::__cxx11::string::_M_assign((string *)(instance::all + instance::curr));
      lVar4 = (long)instance::curr;
      instance::curr = instance::curr + 1;
      break;
    }
    _Var1 = std::operator==(&__lhs->name,name);
    __lhs = __lhs + 1;
  } while (!_Var1);
  return instance::all + lVar4;
}

Assistant:

static counter *instance(std::string const &name)
	{
		static const int max = 20;
		static int curr;
		static counter all[max];
		for(int i=0;i<curr;i++)
			if(all[i].name==name)
				return all + i;
		assert(curr < max);
		all[curr].name = name;
		return all + curr++;
	}